

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O3

void __thiscall UUID_GoodHex_Test::~UUID_GoodHex_Test(UUID_GoodHex_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (UUID, GoodHex) {
    std::string const input = "0099aaff-AAFF-0990-0099-aaffAAFF0990";
    pstore::uuid const expected{
        pstore::uuid::container_type{{0x00, 0x99, 0xAA, 0xFF, 0xAA, 0xFF, 0x09, 0x90, 0x00, 0x99,
                                      0xAA, 0xFF, 0xAA, 0xFF, 0x09, 0x90}}};

    // first try from_string()...
    pstore::maybe<pstore::uuid> v = pstore::uuid::from_string (input);
    ASSERT_TRUE (v.has_value ());
    EXPECT_EQ (*v, expected);

    // now using the constructor
    EXPECT_EQ (expected, pstore::uuid (input));
}